

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavApplyItemToResult(ImGuiNavItemData *result)

{
  ImGuiContext *pIVar1;
  undefined8 *in_RDI;
  ImRect IVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  pIVar1 = GImGui;
  *in_RDI = GImGui->CurrentWindow;
  *(ImGuiID *)(in_RDI + 1) = (pIVar1->LastItemData).ID;
  *(ImGuiID *)((long)in_RDI + 0xc) = pIVar1->CurrentFocusScopeId;
  *(ImGuiItemFlags *)(in_RDI + 4) = (pIVar1->LastItemData).InFlags;
  IVar2 = WindowRectAbsToRel(in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_);
  *(ImVec2 *)(in_RDI + 2) = IVar2.Min;
  *(ImVec2 *)(in_RDI + 3) = IVar2.Max;
  if ((*(uint *)(in_RDI + 4) & 0x200000) != 0) {
    in_RDI[6] = (pIVar1->NextItemData).SelectionUserData;
  }
  return;
}

Assistant:

static void ImGui::NavApplyItemToResult(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    result->Window = window;
    result->ID = g.LastItemData.ID;
    result->FocusScopeId = g.CurrentFocusScopeId;
    result->InFlags = g.LastItemData.InFlags;
    result->RectRel = WindowRectAbsToRel(window, g.LastItemData.NavRect);
    if (result->InFlags & ImGuiItemFlags_HasSelectionUserData)
    {
        IM_ASSERT(g.NextItemData.SelectionUserData != ImGuiSelectionUserData_Invalid);
        result->SelectionUserData = g.NextItemData.SelectionUserData; // INTENTIONAL: At this point this field is not cleared in NextItemData. Avoid unnecessary copy to LastItemData.
    }
}